

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O2

StringRef llvm::Triple::getOSTypeName(OSType Kind)

{
  StringRef SVar1;
  
  if (Kind < 0x20) {
    SVar1.Data = &DAT_001ae630 + *(int *)(&DAT_001ae630 + (ulong)Kind * 4);
    SVar1.Length = *(size_t *)(&DAT_001ae530 + (ulong)Kind * 8);
    return SVar1;
  }
  llvm_unreachable_internal
            ("Invalid OSType",
             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Triple.cpp"
             ,0xd6);
}

Assistant:

StringRef Triple::getOSTypeName(OSType Kind) {
  switch (Kind) {
  case UnknownOS: return "unknown";

  case Ananas: return "ananas";
  case CloudABI: return "cloudabi";
  case Darwin: return "darwin";
  case DragonFly: return "dragonfly";
  case FreeBSD: return "freebsd";
  case Fuchsia: return "fuchsia";
  case IOS: return "ios";
  case KFreeBSD: return "kfreebsd";
  case Linux: return "linux";
  case Lv2: return "lv2";
  case MacOSX: return "macosx";
  case NetBSD: return "netbsd";
  case OpenBSD: return "openbsd";
  case Solaris: return "solaris";
  case Win32: return "windows";
  case Haiku: return "haiku";
  case Minix: return "minix";
  case RTEMS: return "rtems";
  case NaCl: return "nacl";
  case CNK: return "cnk";
  case AIX: return "aix";
  case CUDA: return "cuda";
  case NVCL: return "nvcl";
  case AMDHSA: return "amdhsa";
  case PS4: return "ps4";
  case ELFIAMCU: return "elfiamcu";
  case TvOS: return "tvos";
  case WatchOS: return "watchos";
  case Mesa3D: return "mesa3d";
  case Contiki: return "contiki";
  case AMDPAL: return "amdpal";
  }

  llvm_unreachable("Invalid OSType");
}